

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * anon_unknown.dwarf_8f7285::relativeIfUnder
                   (string *__return_storage_ptr__,string *top,string *cur,string *path)

{
  bool bVar1;
  string *path_local;
  string *cur_local;
  string *top_local;
  
  bVar1 = cmsys::SystemTools::IsSubDirectory(path,cur);
  if ((bVar1) ||
     ((bVar1 = cmsys::SystemTools::IsSubDirectory(cur,top), bVar1 &&
      (bVar1 = cmsys::SystemTools::IsSubDirectory(path,top), bVar1)))) {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,cur,path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string relativeIfUnder(std::string const& top, std::string const& cur,
                            std::string const& path)
{
  // Use a path relative to 'cur' if it can be expressed without
  // a `../` sequence that leaves 'top'.
  if (cmSystemTools::IsSubDirectory(path, cur) ||
      (cmSystemTools::IsSubDirectory(cur, top) &&
       cmSystemTools::IsSubDirectory(path, top))) {
    return cmSystemTools::ForceToRelativePath(cur, path);
  }
  return path;
}